

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

Vec_Ptr_t * Io_ReadBlifGetTokens(Io_ReadBlif_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  size_t sVar4;
  char *pcVar5;
  void **ppvVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  
  if (0 < p->vNewTokens->nSize) {
    pVVar3 = p->vNewTokens;
    if (0 < pVVar3->nSize) {
      lVar8 = 0;
      do {
        if (pVVar3->pArray[lVar8] != (void *)0x0) {
          free(pVVar3->pArray[lVar8]);
          p->vNewTokens->pArray[lVar8] = (void *)0x0;
        }
        lVar8 = lVar8 + 1;
        pVVar3 = p->vNewTokens;
      } while (lVar8 < pVVar3->nSize);
    }
    pVVar3->nSize = 0;
  }
  pVVar3 = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
  if (pVVar3 == (Vec_Ptr_t *)0x0) {
    return (Vec_Ptr_t *)0x0;
  }
  pcVar5 = (char *)pVVar3->pArray[(long)pVVar3->nSize + -1];
  sVar4 = strlen(pcVar5);
  if (pcVar5[sVar4 - 1] != '\\') {
    return pVVar3;
  }
  pcVar5[sVar4 - 1] = '\0';
  if (*pcVar5 == '\0') {
    pVVar3->nSize = pVVar3->nSize + -1;
  }
  if (0 < pVVar3->nSize) {
    lVar8 = 0;
    do {
      pVVar2 = p->vNewTokens;
      pcVar5 = Extra_UtilStrsav((char *)pVVar3->pArray[lVar8]);
      uVar1 = pVVar2->nCap;
      if (pVVar2->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar6;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar1 * 2;
          if (iVar9 <= (int)uVar1) goto LAB_0032c165;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
          pVVar2->pArray = ppvVar6;
        }
        pVVar2->nCap = iVar9;
      }
LAB_0032c165:
      iVar9 = pVVar2->nSize;
      pVVar2->nSize = iVar9 + 1;
      pVVar2->pArray[iVar9] = pcVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar3->nSize);
  }
  pvVar7 = Extra_FileReaderGetTokens(p->pReader);
  iVar9 = *(int *)((long)pvVar7 + 4);
  while (iVar9 != 0) {
    piVar10 = (int *)((long)pvVar7 + 4);
    pcVar5 = *(char **)(*(long *)((long)pvVar7 + 8) + -8 + (long)iVar9 * 8);
    sVar4 = strlen(pcVar5);
    if (pcVar5[sVar4 - 1] != '\\') {
      if (0 < *piVar10) {
        lVar8 = 0;
        goto LAB_0032c2c0;
      }
      break;
    }
    pcVar5[sVar4 - 1] = '\0';
    if (*pcVar5 == '\0') {
      *piVar10 = *piVar10 + -1;
    }
    if (0 < *piVar10) {
      lVar8 = 0;
      do {
        pVVar3 = p->vNewTokens;
        pcVar5 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar7 + 8) + lVar8 * 8));
        uVar1 = pVVar3->nCap;
        if (pVVar3->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar6;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar1 * 2;
            if (iVar9 <= (int)uVar1) goto LAB_0032c261;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
            }
            pVVar3->pArray = ppvVar6;
          }
          pVVar3->nCap = iVar9;
        }
LAB_0032c261:
        iVar9 = pVVar3->nSize;
        pVVar3->nSize = iVar9 + 1;
        pVVar3->pArray[iVar9] = pcVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 < *piVar10);
    }
    pvVar7 = Extra_FileReaderGetTokens(p->pReader);
    iVar9 = *(int *)((long)pvVar7 + 4);
  }
  goto LAB_0032c360;
LAB_0032c2c0:
  do {
    pVVar3 = p->vNewTokens;
    pcVar5 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar7 + 8) + lVar8 * 8));
    uVar1 = pVVar3->nCap;
    if (pVVar3->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar6;
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar1 * 2;
        if (iVar9 <= (int)uVar1) goto LAB_0032c33a;
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
        }
        pVVar3->pArray = ppvVar6;
      }
      pVVar3->nCap = iVar9;
    }
LAB_0032c33a:
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    pVVar3->pArray[iVar9] = pcVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 < *piVar10);
LAB_0032c360:
  return p->vNewTokens;
}

Assistant:

Vec_Ptr_t * Io_ReadBlifGetTokens( Io_ReadBlif_t * p )
{
    Vec_Ptr_t * vTokens;
    char * pLastToken;
    int i;

    // get rid of the old tokens
    if ( p->vNewTokens->nSize > 0 )
    {
        for ( i = 0; i < p->vNewTokens->nSize; i++ )
            ABC_FREE( p->vNewTokens->pArray[i] );
        p->vNewTokens->nSize = 0;
    }

    // get the new tokens
    vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
    if ( vTokens == NULL )
        return vTokens;

    // check if there is a transfer to another line
    pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
    if ( pLastToken[ strlen(pLastToken)-1 ] != '\\' )
        return vTokens;

    // remove the slash
    pLastToken[ strlen(pLastToken)-1 ] = 0;
    if ( pLastToken[0] == 0 )
        vTokens->nSize--;
    // load them into the new array
    for ( i = 0; i < vTokens->nSize; i++ )
        Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );

    // load as long as there is the line break
    while ( 1 )
    {
        // get the new tokens
        vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
        if ( vTokens->nSize == 0 )
            return p->vNewTokens;
        // check if there is a transfer to another line
        pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
        if ( pLastToken[ strlen(pLastToken)-1 ] == '\\' )
        {
            // remove the slash
            pLastToken[ strlen(pLastToken)-1 ] = 0;
            if ( pLastToken[0] == 0 )
                vTokens->nSize--;
            // load them into the new array
            for ( i = 0; i < vTokens->nSize; i++ )
                Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
            continue;
        }
        // otherwise, load them and break
        for ( i = 0; i < vTokens->nSize; i++ )
            Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
        break;
    }
    return p->vNewTokens;
}